

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O1

NaReal __thiscall NaVector::distance(NaVector *this,NaVector *that)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  iVar1 = (*this->_vptr_NaVector[6])();
  dVar4 = 0.0;
  if (iVar1 != 0) {
    uVar3 = 0;
    do {
      dVar5 = this->pVect[uVar3] - that->pVect[uVar3];
      dVar4 = dVar4 + dVar5 * dVar5;
      uVar3 = uVar3 + 1;
      uVar2 = (*this->_vptr_NaVector[6])(this);
    } while (uVar3 < uVar2);
  }
  if (0.0 <= dVar4) {
    return SQRT(dVar4);
  }
  dVar4 = sqrt(dVar4);
  return dVar4;
}

Assistant:

NaReal
NaVector::distance (const NaVector& that) const
{
    unsigned    i;
    NaReal      vDist = 0.0;
    NaReal      vTmp;
    for(i = 0; i < dim(); ++i){
        vTmp = pVect[i] - that.pVect[i];
        vDist += vTmp * vTmp;
    }
    return sqrt(vDist);
}